

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::MedianFunction::Bind
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  AggregateFunction *in_stack_fffffffffffffe38;
  unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>_> *puVar1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  _Head_base<0UL,_duckdb::QuantileBindData_*,_false> in_stack_fffffffffffffe58;
  
  this._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_RDI._M_t.
                  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                  .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,
               (size_type)in_stack_fffffffffffffe38);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             this._M_head_impl);
  GetAggregate((LogicalType *)in_stack_fffffffffffffe58._M_head_impl);
  AggregateFunction::operator=((AggregateFunction *)this._M_head_impl,in_stack_fffffffffffffe38);
  AggregateFunction::~AggregateFunction((AggregateFunction *)this._M_head_impl);
  puVar1 = (unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>_> *)
           &stack0xfffffffffffffe58;
  duckdb::Value::DECIMAL((short)puVar1,'\x05','\x02');
  make_uniq<duckdb::QuantileBindData,duckdb::Value>((Value *)in_stack_fffffffffffffe58._M_head_impl)
  ;
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::QuantileBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             this._M_head_impl,puVar1);
  unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QuantileBindData,_std::default_delete<duckdb::QuantileBindData>,_true>
               *)0xaaed37);
  duckdb::Value::~Value((Value *)&stack0xfffffffffffffe58);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, AggregateFunction &function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		function = GetAggregate(arguments[0]->return_type);
		return make_uniq<QuantileBindData>(Value::DECIMAL(int16_t(5), 2, 1));
	}